

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O1

int __thiscall PlatformWindowData::rename(PlatformWindowData *this,char *__old,char *__new)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 unaff_RBP;
  char *__s;
  string title2;
  
  to_utf8_string(&title2,(wstring *)__old);
  lVar1 = XInternAtom(this->display,"_NET_WM_NAME",1);
  lVar2 = XInternAtom(this->display,"UTF8_STRING",1);
  if (lVar1 == 0) {
    __s = "_NET_WM_NAME not found. Window title was not set.";
  }
  else {
    if (lVar2 != 0) {
      XChangeProperty(this->display,this->handle,lVar1,lVar2,8,0,title2._M_dataplus._M_p,
                      (undefined4)title2._M_string_length);
      iVar3 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      std::__cxx11::wstring::_M_assign((wstring *)&this->title);
      goto LAB_0010ed89;
    }
    __s = "UTF8_STRING not found. Window title was not set.";
  }
  puts(__s);
  iVar3 = 0;
LAB_0010ed89:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)title2._M_dataplus._M_p != &title2.field_2) {
    operator_delete(title2._M_dataplus._M_p,title2.field_2._M_allocated_capacity + 1);
  }
  return iVar3;
}

Assistant:

bool rename(std::wstring const& name)
	{
		auto title2 = to_utf8_string(name);
		Atom wmname = XInternAtom(display, "_NET_WM_NAME", True);
		Atom utf8str = XInternAtom(display, "UTF8_STRING", True);
		if(wmname == None){ printf("_NET_WM_NAME not found. Window title was not set.\n"); }
		else
		{
			if(utf8str == None){ printf("UTF8_STRING not found. Window title was not set.\n"); }
			else
			{
				XChangeProperty(display, handle, wmname, utf8str, 8, PropModeReplace, (const unsigned char*)title2.c_str(), title2.size());
				title = name;
				return true;
			}
		}
		return false;
	}